

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_classes.h
# Opt level: O3

unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
 get_output<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           (flagser_parameters *params)

{
  string *__rhs;
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  int iVar5;
  betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *this;
  long *plVar6;
  invalid_argument *this_00;
  long *plVar7;
  flagser_parameters *in_RSI;
  undefined1 auVar8 [16];
  string err_msg;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __rhs = &in_RSI->output_format;
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar5 == 0) {
    this = (betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            *)operator_new(0x250);
    betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
    ::betti_output_t(this,in_RSI);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar5 == 0) {
      this = (betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
              *)operator_new(0x250);
      barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
      ::barcode_output_t((barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                          *)this,in_RSI);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 != 0) {
        std::operator+(&local_38,"The output format \"",__rhs);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
        local_58 = (long *)*plVar6;
        plVar7 = plVar6 + 2;
        if (local_58 == plVar7) {
          local_48 = *plVar7;
          lStack_40 = plVar6[3];
          local_58 = &local_48;
        }
        else {
          local_48 = *plVar7;
        }
        local_50 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,(string *)&local_58);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      this = (betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
              *)operator_new(0x50);
      (this->
      super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
      ).
      super_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
      ._vptr_output_t = (_func_int **)&PTR__trivial_output_t_0014e9f0;
      *(undefined2 *)
       &(this->
        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
        ).field_0x10 = 0;
      uVar1 = in_RSI->max_dimension;
      uVar2 = in_RSI->min_dimension;
      uVar3 = in_RSI->modulus;
      uVar4 = *(undefined2 *)&in_RSI->field_0x6;
      auVar8._6_2_ = uVar4;
      auVar8._4_2_ = uVar3;
      auVar8._2_2_ = uVar2;
      auVar8._0_2_ = uVar1;
      auVar8._8_8_ = 0;
      auVar8 = pshuflw(auVar8,auVar8,0xe1);
      *(int *)&(this->
               super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               ).field_0x12 = auVar8._0_4_;
      *(coefficient_t *)
       &(this->
        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
        ).field_0x16 = in_RSI->modulus;
      *(undefined1 (*) [16])
       &(this->
        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
        ).field_0x38 = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       &(this->
        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
        ).field_0x28 = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       &(this->
        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
        ).field_0x18 = (undefined1  [16])0x0;
      *(undefined4 *)
       &(this->
        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
        ).field_0x48 = 0;
      (this->
      super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
      ).field_0x4c = in_RSI->approximate_computation;
      (this->
      super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
      ).field_0x4d = in_RSI->split_into_connected_components ^ 1;
    }
  }
  *(betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
    **)params = this;
  return (__uniq_ptr_data<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>,_true,_true>
          )(__uniq_ptr_data<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>,_true,_true>
            )params;
}

Assistant:

std::unique_ptr<output_t<Complex>> get_output(const flagser_parameters& params) {
	// using std namespace because of std::make_unique workaround
	// This restrict the scope to inside the function
	using namespace std;

	if (params.output_format == "betti") return make_unique<betti_output_t<Complex>>(params);
	if (params.output_format == "barcode") return make_unique<barcode_output_t<Complex>>(params);

	if (params.output_format == "none") return make_unique<trivial_output_t<Complex>>(params);

#ifdef WITH_HDF5
	if (params.output_format == "barcode:hdf5") return make_unique<barcode_hdf5_output_t<Complex>>(params);
#endif

	std::string err_msg = "The output format \"" + params.output_format + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}